

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation_tests.cpp
# Opt level: O0

void __thiscall
translation_tests::translation_namedparams::test_method(translation_namedparams *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  bilingual_str result;
  bilingual_str format;
  bilingual_str arg;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  lazy_ostream *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  size_t line_num;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  lazy_ostream *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bilingual_str *args;
  bilingual_str *fmt;
  undefined1 local_170 [16];
  undefined1 local_160 [64];
  undefined1 local_120 [16];
  undefined1 local_110 [68];
  undefined1 local_cc [2];
  allocator<char> local_ca;
  allocator<char> local_c9;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  bilingual_str local_88 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (allocator<char> *)in_stack_fffffffffffffe28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (allocator<char> *)in_stack_fffffffffffffe28);
  std::allocator<char>::~allocator(&local_ca);
  std::allocator<char>::~allocator(&local_c9);
  fmt = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             (allocator<char> *)in_stack_fffffffffffffe28);
  this_00 = &local_88[0].translated;
  args = (bilingual_str *)local_cc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe30,(allocator<char> *)in_stack_fffffffffffffe28);
  std::allocator<char>::~allocator((allocator<char> *)local_cc);
  std::allocator<char>::~allocator((allocator<char> *)(local_cc + 1));
  tinyformat::format<bilingual_str>(fmt,args);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe28,
               (const_string *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,(const_string *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdf0,(char (*) [1])in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdf8 = "\"original [original]\"";
    in_stack_fffffffffffffdf0 = "original [original]";
    in_stack_fffffffffffffde8 = "result.original";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[20]>
              (local_110,local_120,0x11,1,2,local_c8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffde8);
    in_stack_fffffffffffffe27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe27);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe28,
               (const_string *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               line_num,(const_string *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe10 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdf0,(char (*) [1])in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdf8 = "\"translated [translated]\"";
    in_stack_fffffffffffffdf0 = "translated [translated]";
    in_stack_fffffffffffffde8 = "result.translated";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
              (local_160,local_170,0x12,1,2,local_a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffde8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffde8);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffde8);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffde8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(translation_namedparams)
{
    bilingual_str arg{"original", "translated"};
    bilingual_str format{"original [%s]", "translated [%s]"};
    bilingual_str result{strprintf(format, arg)};
    BOOST_CHECK_EQUAL(result.original, "original [original]");
    BOOST_CHECK_EQUAL(result.translated, "translated [translated]");
}